

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

void __thiscall
onmt::Tokenizer::finalize_tokens
          (Tokenizer *this,vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *features)

{
  string *psVar1;
  pointer __rhs;
  Casing casing;
  pointer pTVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  pointer pbVar6;
  string *psVar7;
  pointer pbVar8;
  string *token;
  long lVar9;
  undefined1 *puVar10;
  size_t j;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  allocator<char> local_18a;
  allocator<char> local_189;
  string final_token;
  vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> case_markups;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(tokens,((long)(annotated_tokens->
                          super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(annotated_tokens->
                         super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                         super__Vector_impl_data._M_start) / 0x48);
  pTVar2 = (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    pbVar8 = (pTVar2->features).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (pTVar2->features).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar8 != pbVar6) {
      lVar5 = (long)pbVar6 - (long)pbVar8 >> 5;
      goto LAB_001f6649;
    }
  }
  lVar5 = 0;
LAB_001f6649:
  lVar5 = (ulong)(this->_options).case_feature + lVar5;
  while (bVar13 = lVar5 != 0, lVar5 = lVar5 + -1, bVar13) {
    final_token._M_dataplus._M_p = final_token._M_dataplus._M_p & 0xffffffff00000000;
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::emplace_back<int>(features,(int *)&final_token);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((features->
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish + -1,
              ((long)(annotated_tokens->
                     super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x48);
  }
  case_markups.super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  case_markups.super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  case_markups.super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->_options).case_markup != false) {
    get_case_markups((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
                     &final_token,annotated_tokens,(this->_options).soft_case_regions);
    std::vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::_M_move_assign
              (&case_markups,&final_token);
    std::_Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::~_Vector_base
              ((_Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
               &final_token);
  }
  psVar1 = &(this->_options).joiner;
  uVar12 = 0;
  do {
    pTVar2 = (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(annotated_tokens->
                       super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pTVar2) / 0x48) <= uVar12) {
      std::_Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>::
      ~_Vector_base(&case_markups.
                     super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>
                   );
      return;
    }
    __rhs = pTVar2 + uVar12;
    casing = pTVar2[uVar12].casing;
    pbVar8 = pTVar2[uVar12].features.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = *(pointer *)
              ((long)&pTVar2[uVar12].features.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl + 8);
    if (pbVar8 != pbVar6) {
      lVar5 = 0;
      lVar9 = 0;
      for (uVar11 = 0; uVar11 < (ulong)((long)pbVar6 - (long)pbVar8 >> 5); uVar11 = uVar11 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&(((features->
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data + lVar5),
                    (value_type *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9));
        pbVar8 = *(pointer *)
                  &(__rhs->features).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ;
        pbVar6 = *(pointer *)
                  ((long)&(__rhs->features).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 8);
        lVar9 = lVar9 + 0x20;
        lVar5 = lVar5 + 0x18;
      }
    }
    if ((this->_options).case_markup == true) {
      if (case_markups.
          super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12].prefix != None) {
        write_case_markup_abi_cxx11_
                  (&final_token,
                   (onmt *)(ulong)case_markups.
                                  super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar12].prefix,
                   case_markups.
                   super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].casing,(int)uVar12 * 0xc);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tokens,
                   &final_token);
        std::__cxx11::string::~string((string *)&final_token);
      }
    }
    bVar13 = __rhs->preserve;
    if ((this->_options).joiner_annotate == true) {
      puVar10 = (string *)0x0;
      if (__rhs->join_left != false) {
        puVar10 = (undefined1 *)psVar1;
      }
      if (uVar12 == 0) {
        puVar10 = (string *)0x0;
      }
      psVar7 = (string *)0x0;
      if ((__rhs->join_right == true) &&
         (psVar7 = (string *)0x0,
         uVar12 + 1 <
         (ulong)(((long)(annotated_tokens->
                        super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(annotated_tokens->
                       super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                       super__Vector_impl_data._M_start) / 0x48))) {
        psVar7 = (string *)psVar1;
      }
      bVar3 = (this->_options).joiner_new ^ 1;
      bVar4 = 0;
      if (__rhs->spacer != false) {
        bVar4 = bVar3;
      }
      if (bVar13 == false) {
        bVar4 = bVar3;
      }
    }
    else if ((this->_options).spacer_annotate == true) {
      if (uVar12 == 0) {
        if (__rhs->spacer != false) goto LAB_001f6844;
LAB_001f6860:
        puVar10 = (string *)0x0;
      }
      else {
        if ((__rhs->join_left != false) ||
           ((annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar12 - 1].join_right != false))
        goto LAB_001f6860;
LAB_001f6844:
        puVar10 = spacer_marker_abi_cxx11_;
      }
      bVar4 = (this->_options).spacer_new ^ 1;
      if (bVar13 != false) {
        bVar4 = 0;
      }
      psVar7 = (string *)0x0;
    }
    else {
      puVar10 = (string *)0x0;
      psVar7 = (string *)0x0;
      bVar4 = bVar13 ^ 1;
    }
    if ((string *)puVar10 == (string *)0x0 && psVar7 == (string *)0x0) {
      bVar13 = (this->_options).case_feature;
      std::__cxx11::string::string((string *)&local_50,(string *)__rhs);
      token = &local_50;
      add_final_token(tokens,features,bVar13,token,casing);
LAB_001f6ae1:
      std::__cxx11::string::~string((string *)token);
    }
    else {
      if ((bVar4 & 1) != 0) {
        if ((string *)puVar10 == (string *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_189);
        }
        else {
          std::__cxx11::string::string((string *)&local_110,(string *)puVar10);
        }
        std::operator+(&local_f0,&local_110,&__rhs->surface);
        if (psVar7 == (string *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_18a);
        }
        else {
          std::__cxx11::string::string((string *)&local_70,psVar7);
        }
        std::operator+(&final_token,&local_f0,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)final_token._M_dataplus._M_p == &final_token.field_2) {
          local_130.field_2._8_8_ = final_token.field_2._8_8_;
        }
        else {
          local_130._M_dataplus._M_p = final_token._M_dataplus._M_p;
        }
        local_130.field_2._M_allocated_capacity._1_7_ =
             final_token.field_2._M_allocated_capacity._1_7_;
        local_130.field_2._M_local_buf[0] = final_token.field_2._M_local_buf[0];
        local_130._M_string_length = final_token._M_string_length;
        final_token._M_string_length = 0;
        final_token.field_2._M_local_buf[0] = '\0';
        final_token._M_dataplus._M_p = (pointer)&final_token.field_2;
        add_final_token(tokens,features,(this->_options).case_feature,&local_130,casing);
        std::__cxx11::string::~string((string *)&local_130);
        token = &final_token;
        goto LAB_001f6ae1;
      }
      bVar4 = (this->_options).case_feature;
      if ((string *)puVar10 != (string *)0x0) {
        std::__cxx11::string::string((string *)&local_90,(string *)puVar10);
        add_final_token(tokens,features,(bool)(bVar4 & 1),&local_90,None);
        std::__cxx11::string::~string((string *)&local_90);
        bVar4 = (this->_options).case_feature;
      }
      std::__cxx11::string::string((string *)&local_b0,(string *)__rhs);
      add_final_token(tokens,features,(bool)(bVar4 & 1),&local_b0,casing);
      std::__cxx11::string::~string((string *)&local_b0);
      if (psVar7 != (string *)0x0) {
        bVar13 = (this->_options).case_feature;
        std::__cxx11::string::string((string *)&local_d0,psVar7);
        token = &local_d0;
        add_final_token(tokens,features,bVar13,token,None);
        goto LAB_001f6ae1;
      }
    }
    if ((this->_options).case_markup == true) {
      if (case_markups.
          super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12].suffix != None) {
        write_case_markup_abi_cxx11_
                  (&final_token,
                   (onmt *)(ulong)case_markups.
                                  super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar12].suffix,
                   case_markups.
                   super__Vector_base<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].casing,(int)uVar12 * 0xc);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tokens,
                   &final_token);
        std::__cxx11::string::~string((string *)&final_token);
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void Tokenizer::finalize_tokens(const std::vector<Token>& annotated_tokens,
                                  std::vector<std::string>& tokens,
                                  std::vector<std::vector<std::string>>& features) const
  {
    tokens.reserve(annotated_tokens.size());
    size_t num_features = 0;
    if (annotated_tokens.size() > 0 && annotated_tokens[0].has_features())
      num_features = annotated_tokens[0].features.size();
    if (_options.case_feature)
      num_features += 1;

    for (size_t i = 0; i < num_features; ++i)
    {
      features.emplace_back(0);
      features.back().reserve(annotated_tokens.size());
    }

    std::vector<TokenCaseMarkup> case_markups;
    if (_options.case_markup)
      case_markups = get_case_markups(annotated_tokens, _options.soft_case_regions);

    for (size_t i = 0; i < annotated_tokens.size(); ++i)
    {
      const auto& token = annotated_tokens[i];
      const auto& str = token.surface;
      const auto casing = token.casing;

      if (token.has_features())
      {
        const auto& token_features = token.features;
        for (size_t j = 0; j < token_features.size(); ++j)
          features[j].push_back(token_features[j]);
      }

      if (_options.case_markup && case_markups[i].prefix != CaseMarkupType::None)
        tokens.emplace_back(write_case_markup(case_markups[i].prefix, case_markups[i].casing));

      const std::string* prefix = nullptr;
      const std::string* suffix = nullptr;
      bool attach = !token.preserve;

      if (_options.joiner_annotate)
      {
        if (token.join_left && i > 0)
          prefix = &_options.joiner;
        if (token.join_right && i + 1 < annotated_tokens.size())
          suffix = &_options.joiner;
        if (token.spacer)
          attach = true;  // Ignore preserve flag for spacers in joiner mode.
        attach = attach && !_options.joiner_new;
      }
      else if (_options.spacer_annotate)
      {
        if ((i == 0 && token.spacer)
            || (i > 0 && !token.join_left && !annotated_tokens[i - 1].join_right))
          prefix = &spacer_marker;
        attach = attach && !_options.spacer_new;
      }

      if (!prefix && !suffix)
        add_final_token(tokens, features, _options.case_feature, str, casing);
      else if (attach)
      {
        std::string final_token = (prefix ? *prefix : "") + str + (suffix ? *suffix : "");
        add_final_token(tokens, features, _options.case_feature, std::move(final_token), casing);
      }
      else
      {
        if (prefix)
          add_final_token(tokens, features, _options.case_feature, *prefix);
        add_final_token(tokens, features, _options.case_feature, str, casing);
        if (suffix)
          add_final_token(tokens, features, _options.case_feature, *suffix);
      }

      if (_options.case_markup && case_markups[i].suffix != CaseMarkupType::None)
        tokens.emplace_back(write_case_markup(case_markups[i].suffix, case_markups[i].casing));
    }
  }